

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeQueue.h
# Opt level: O2

int __thiscall ThreadSafeQueue<int>::pop(ThreadSafeQueue<int> *this)

{
  int iVar1;
  int *piVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->m_mutex);
  while (piVar2 = (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur,
        (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == piVar2) {
    std::condition_variable::wait((unique_lock *)&this->m_cv);
  }
  iVar1 = *piVar2;
  std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return iVar1;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(m_mutex);
		while (m_queue.empty())
		{
			m_cv.wait(lock);
		}

		auto item = std::move(m_queue.front());
		m_queue.pop();
		return item;
	}